

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1angle.cc
# Opt level: O0

ostream * operator<<(ostream *os,S1Angle a)

{
  uint uVar1;
  char local_35;
  int sz;
  char buffer [13];
  double degrees;
  ostream *os_local;
  S1Angle a_local;
  
  os_local = (ostream *)a.radians_;
  buffer._5_8_ = S1Angle::degrees((S1Angle *)&os_local);
  uVar1 = snprintf(&local_35,0xd,"%.7f",buffer._5_8_);
  if (((int)uVar1 < 0) || (0xc < uVar1)) {
    a_local.radians_ = (double)std::ostream::operator<<(os,(double)buffer._5_8_);
  }
  else {
    a_local.radians_ = (double)std::operator<<(os,&local_35);
  }
  return (ostream *)a_local.radians_;
}

Assistant:

std::ostream& operator<<(std::ostream& os, S1Angle a) {
  double degrees = a.degrees();
  char buffer[13];
  int sz = snprintf(buffer, sizeof(buffer), "%.7f", degrees);
  if (sz >= 0 && sz < sizeof(buffer)) {
    return os << buffer;
  } else {
    return os << degrees;
  }
}